

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

_Bool ts_subtree_has_trailing_empty_descendant(Subtree self,Subtree other)

{
  Subtree self_00;
  _Bool _Var1;
  ulong uVar2;
  bool bVar3;
  Length LVar4;
  
  if (((ulong)self.ptr & 1) == 0) {
    uVar2 = (ulong)(self.ptr)->child_count;
  }
  else {
    uVar2 = 0;
  }
  do {
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) {
      return false;
    }
    self_00 = ((self.ptr)->field_17).field_0.children[uVar2];
    LVar4 = ts_subtree_total_size(self_00);
    if (LVar4.bytes != 0) {
      return false;
    }
    if (self_00.ptr == other.ptr) {
      return true;
    }
    _Var1 = ts_subtree_has_trailing_empty_descendant(self_00,other);
  } while (!_Var1);
  return true;
}

Assistant:

static bool ts_subtree_has_trailing_empty_descendant(Subtree self, Subtree other) {
  for (unsigned i = ts_subtree_child_count(self) - 1; i + 1 > 0; i--) {
    Subtree child = self.ptr->children[i];
    if (ts_subtree_total_bytes(child) > 0) break;
    if (child.ptr == other.ptr || ts_subtree_has_trailing_empty_descendant(child, other)) {
      return true;
    }
  }
  return false;
}